

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::peer_log
          (peer_connection *this,direction_t direction,char *event,char *fmt,...)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  exception *anon_var_0;
  undefined1 local_78 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  torrent_handle h;
  va_list v;
  char *local_28;
  char *fmt_local;
  char *event_local;
  peer_connection *ppStack_10;
  direction_t direction_local;
  peer_connection *this_local;
  
  local_28 = fmt;
  fmt_local = event;
  event_local._4_4_ = direction;
  ppStack_10 = this;
  iVar2 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  bVar1 = alert_manager::should_post<libtorrent::peer_log_alert>
                    ((alert_manager *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    h.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0x30;
    h.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 0x20;
    torrent_handle::torrent_handle
              ((torrent_handle *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_78);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
    if (bVar1) {
      ::std::__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_78);
      torrent::get_handle((torrent *)&anon_var_0);
      torrent_handle::operator=
                ((torrent_handle *)
                 &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(torrent_handle *)&anon_var_0);
      torrent_handle::~torrent_handle((torrent_handle *)&anon_var_0);
    }
    iVar2 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
              _vptr_session_logger[5])();
    alert_manager::
    emplace_alert<libtorrent::peer_log_alert,libtorrent::torrent_handle&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,libtorrent::peer_log_alert::direction_t&,char_const*&,char_const*&,__va_list_tag(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar2),
               (torrent_handle *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&this->m_remote,&this->m_peer_id,(direction_t *)((long)&event_local + 4)
               ,&fmt_local,&local_28,
               (__va_list_tag (*) [1])
               &h.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_78);
    torrent_handle::~torrent_handle
              ((torrent_handle *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void peer_connection::peer_log(peer_log_alert::direction_t direction
		, char const* event, char const* fmt, ...) const noexcept try
	{
		TORRENT_ASSERT(is_single_thread());

		if (!m_ses.alerts().should_post<peer_log_alert>()) return;

		va_list v;
		va_start(v, fmt);

		torrent_handle h;
		auto t = m_torrent.lock();
		if (t) h = t->get_handle();

		m_ses.alerts().emplace_alert<peer_log_alert>(
			h, m_remote, m_peer_id, direction, event, fmt, v);

		va_end(v);

	}
	catch (std::exception const&) {}